

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O3

void nn_binproc_destroy(nn_epbase *self)

{
  if (self != (nn_epbase *)0x0) {
    self = (nn_epbase *)(self + -6);
  }
  nn_list_term((nn_list *)&((nn_fsm *)((long)self + 0x58))->stopped);
  nn_fsm_term((nn_fsm *)self);
  nn_ins_item_term((nn_ins_item *)&((nn_fsm *)((long)self + 0x58))->shutdown_fn);
  nn_free(self);
  return;
}

Assistant:

static void nn_binproc_destroy (struct nn_epbase *self)
{
    struct nn_binproc *binproc;

    binproc = nn_cont (self, struct nn_binproc, item.epbase);

    nn_list_term (&binproc->sinprocs);
    nn_fsm_term (&binproc->fsm);
    nn_ins_item_term (&binproc->item);

    nn_free (binproc);
}